

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySet.cxx
# Opt level: O1

void __thiscall
cmInstallRuntimeDependencySet::TargetItem::AddPostExcludeFiles
          (TargetItem *this,string *config,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,cmInstallRuntimeDependencySet *set)

{
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *psVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  string local_50;
  
  psVar1 = anon_unknown.dwarf_1b3d3f2::GetTargetDependsClosure
                     (&set->TargetDepends,this->Target->Target);
  p_Var2 = (psVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(psVar1->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      cmGeneratorTarget::GetFullPath
                (&local_50,*(cmGeneratorTarget **)(p_Var2 + 1),config,RuntimeBinaryArtifact,false);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)files,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return;
}

Assistant:

void cmInstallRuntimeDependencySet::TargetItem::AddPostExcludeFiles(
  const std::string& config, std::set<std::string>& files,
  cmInstallRuntimeDependencySet* set) const
{
  for (auto const* dep : GetTargetDependsClosure(set->TargetDepends,
                                                 this->Target->GetTarget())) {
    files.insert(dep->GetFullPath(config));
  }
}